

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,PrimaryNode *primaryNode)

{
  int iVar1;
  ExpNode *pEVar2;
  TokenNode *pTVar3;
  VarSymbol *pVVar4;
  
  pEVar2 = primaryNode->exp;
  if (pEVar2 != (ExpNode *)0x0) {
    (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
    (primaryNode->super_ExpNode).type = pEVar2->type;
    (primaryNode->super_ExpNode).typeLexeme = pEVar2->lexeme;
    (primaryNode->super_ExpNode).pointer = pEVar2->pointer;
    (primaryNode->super_ExpNode).arraySize = pEVar2->arraySize;
    (primaryNode->super_ExpNode).lValue = pEVar2->lValue;
  }
  pTVar3 = primaryNode->token;
  if (pTVar3 != (TokenNode *)0x0) {
    (*(pTVar3->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar3,this);
    pVVar4 = VarTable::cSearch(varTable,(pTVar3->super_ExpNode).lexeme);
    iVar1 = (pTVar3->super_ExpNode).type;
    if ((iVar1 == 10) || (iVar1 == -0x2a)) {
      if (pVVar4 == (VarSymbol *)0x0) {
        fprintf(_stderr,"[SEMANTIC ERROR - primaryNode] UNDEFINED SYMBOL, line %d lexeme: %s\n",
                (ulong)(uint)(primaryNode->super_ExpNode).super_StmtNode.super_ASTNode.line,
                (pTVar3->super_ExpNode).lexeme);
        return;
      }
      pTVar3 = pVVar4->type->id;
      (primaryNode->super_ExpNode).type = pTVar3->token;
      (primaryNode->super_ExpNode).typeLexeme = (pTVar3->super_ExpNode).typeLexeme;
      (primaryNode->super_ExpNode).pointer = pVVar4->pointer;
      (primaryNode->super_ExpNode).arraySize = pVVar4->arraySize;
      (primaryNode->super_ExpNode).lValue = true;
    }
    else {
      (primaryNode->super_ExpNode).type = iVar1;
      (primaryNode->super_ExpNode).typeLexeme = (pTVar3->super_ExpNode).typeLexeme;
      (primaryNode->super_ExpNode).pointer = (pTVar3->super_ExpNode).pointer;
      (primaryNode->super_ExpNode).arraySize = (pTVar3->super_ExpNode).arraySize;
      (primaryNode->super_ExpNode).lValue = (pTVar3->super_ExpNode).lValue;
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(PrimaryNode *primaryNode) {

    ExpNode *expNode = primaryNode->getExp();

    if (expNode) {
        expNode->accept(this);

        primaryNode->setType(expNode->getType());
        primaryNode->setTypeLexeme(expNode->getLexeme());
        primaryNode->setPointer(expNode->isPointer());
        primaryNode->setArraySize(expNode->getArraySize());
        primaryNode->setLValue(expNode->isLValue());
    }


    TokenNode *tokenNode = primaryNode->getTokenNode();
    if (tokenNode) {
        tokenNode->accept(this);

        VarSymbol *varSymbol = varTable->cSearch(tokenNode->getLexeme());

        //if token is a variable, check if it exists
        if ((tokenNode->getType() == ID || tokenNode->getType() == UNASSIGNED_TOKEN)) {
            if (varSymbol) {

                primaryNode->setType(varSymbol->getType()->getType());
                primaryNode->setTypeLexeme(varSymbol->getType()->getTypeLexeme());
                primaryNode->setPointer(varSymbol->isPointer());
                primaryNode->setArraySize(varSymbol->getArraySize());
                primaryNode->setLValue(true);
            } else {
                fprintf(stderr, "[SEMANTIC ERROR - primaryNode] UNDEFINED SYMBOL, line %d lexeme: %s\n",
                        primaryNode->getLine(), tokenNode->getLexeme());
            }

            return;
        }

        primaryNode->setType(tokenNode->getType());
        primaryNode->setTypeLexeme(tokenNode->getTypeLexeme());
        primaryNode->setPointer(tokenNode->isPointer());
        primaryNode->setArraySize(tokenNode->getArraySize());
        primaryNode->setLValue(tokenNode->isLValue());
    }


}